

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_storage.cpp
# Opt level: O3

void __thiscall libtorrent::aux::mmap_storage::~mmap_storage(mmap_storage *this)

{
  _Atomic_word *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  part_file *this_00;
  _Head_base<0UL,_unsigned_int_*,_false> _Var3;
  pointer pcVar4;
  pointer psVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  int iVar7;
  error_code ec;
  error_code local_20;
  
  local_20.val_ = 0;
  local_20.failed_ = false;
  local_20.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  this_00 = (this->m_part_file)._M_t.
            super___uniq_ptr_impl<libtorrent::aux::part_file,_std::default_delete<libtorrent::aux::part_file>_>
            ._M_t.
            super__Tuple_impl<0UL,_libtorrent::aux::part_file_*,_std::default_delete<libtorrent::aux::part_file>_>
            .super__Head_base<0UL,_libtorrent::aux::part_file_*,_false>._M_head_impl;
  if (this_00 != (part_file *)0x0) {
    part_file::flush_metadata(this_00,&local_20);
  }
  file_pool_impl<libtorrent::aux::file_view_entry>::release
            (this->m_pool,(storage_index_t)(this->m_storage_index).m_val);
  _Var3._M_head_impl =
       *(uint **)&(this->m_file_created).super_bitfield.m_buf.
                  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
  if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var3._M_head_impl !=
      (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
    operator_delete__(_Var3._M_head_impl);
  }
  (this->m_file_created).super_bitfield.m_buf.
  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> =
       (_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)0x0;
  ::std::unique_ptr<libtorrent::aux::part_file,_std::default_delete<libtorrent::aux::part_file>_>::
  ~unique_ptr(&this->m_part_file);
  ::std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            ((_Bvector_base<std::allocator<bool>_> *)&this->m_use_partfile);
  pcVar4 = (this->m_part_file_name)._M_dataplus._M_p;
  paVar2 = &(this->m_part_file_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar2) {
    operator_delete(pcVar4,paVar2->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->m_save_path)._M_dataplus._M_p;
  paVar2 = &(this->m_save_path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar2) {
    operator_delete(pcVar4,paVar2->_M_allocated_capacity + 1);
  }
  psVar5 = (this->m_file_priority).
           super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
           .
           super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar5 != (pointer)0x0) {
    operator_delete(psVar5,(long)(this->m_file_priority).
                                 super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                                 .
                                 super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar5);
  }
  stat_cache::~stat_cache(&this->m_stat_cache);
  ::std::unique_ptr<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>::
  ~unique_ptr(&this->m_mapped_files);
  p_Var6 = (this->m_torrent).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  p_Var6 = (this->super_enable_shared_from_this<libtorrent::aux::mmap_storage>)._M_weak_this.
           super___weak_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var6->_M_weak_count;
      iVar7 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar7 = p_Var6->_M_weak_count;
      p_Var6->_M_weak_count = iVar7 + -1;
    }
    if (iVar7 == 1) {
      (*p_Var6->_vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

mmap_storage::~mmap_storage()
	{
		error_code ec;
		if (m_part_file) m_part_file->flush_metadata(ec);

		// this may be called from a different
		// thread than the disk thread
		m_pool.release(storage_index());
	}